

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QPen>::emplace<QPen_const&>
          (QMovableArrayOps<QPen> *this,qsizetype i,QPen *args)

{
  QPen **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  QPen *pQVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QPen tmp;
  QPen local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QPen>).super_QArrayDataPointer<QPen>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_002aacca:
    local_30.d.d.ptr = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
    QPen::QPen(&local_30,args);
    bVar6 = (this->super_QGenericArrayOps<QPen>).super_QArrayDataPointer<QPen>.size != 0;
    QArrayDataPointer<QPen>::detachAndGrow
              ((QArrayDataPointer<QPen> *)this,(uint)(i == 0 && bVar6),1,(QPen **)0x0,
               (QArrayDataPointer<QPen> *)0x0);
    pQVar5 = (this->super_QGenericArrayOps<QPen>).super_QArrayDataPointer<QPen>.ptr;
    if (i == 0 && bVar6) {
      pQVar5[-1].d.d.ptr = (QPenPrivate *)local_30.d.d.ptr;
      ppQVar1 = &(this->super_QGenericArrayOps<QPen>).super_QArrayDataPointer<QPen>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    else {
      memmove(pQVar5 + i + 1,pQVar5 + i,
              ((this->super_QGenericArrayOps<QPen>).super_QArrayDataPointer<QPen>.size - i) * 8);
      pQVar5[i].d.d.ptr = (QPenPrivate *)local_30.d.d.ptr;
    }
    local_30.d.d.ptr = (DataPtr)(totally_ordered_wrapper<QPenPrivate_*>)0x0;
    pqVar2 = &(this->super_QGenericArrayOps<QPen>).super_QArrayDataPointer<QPen>.size;
    *pqVar2 = *pqVar2 + 1;
    QPen::~QPen(&local_30);
  }
  else {
    lVar4 = (this->super_QGenericArrayOps<QPen>).super_QArrayDataPointer<QPen>.size;
    if ((lVar4 == i && pDVar3 != (Data *)0x0) &&
       ((pDVar3->super_QArrayData).alloc !=
        ((long)((long)(this->super_QGenericArrayOps<QPen>).super_QArrayDataPointer<QPen>.ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) +
        lVar4)) {
      QPen::QPen((this->super_QGenericArrayOps<QPen>).super_QArrayDataPointer<QPen>.ptr + lVar4,args
                );
    }
    else {
      if (((i != 0) || (pDVar3 == (Data *)0x0)) ||
         ((QPen *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QGenericArrayOps<QPen>).super_QArrayDataPointer<QPen>.ptr))
      goto LAB_002aacca;
      QPen::QPen((this->super_QGenericArrayOps<QPen>).super_QArrayDataPointer<QPen>.ptr + -1,args);
      ppQVar1 = &(this->super_QGenericArrayOps<QPen>).super_QArrayDataPointer<QPen>.ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QPen>).super_QArrayDataPointer<QPen>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }